

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isubd-cc.cpp
# Opt level: O2

void renderGui(double cpuDt,double gpuDt)

{
  bool bVar1;
  ImDrawData *draw_data;
  char *pcVar2;
  PatchManager *v;
  char *pcVar3;
  int i;
  ulong uVar4;
  undefined4 uVar5;
  char *aaItems [5];
  char buf [1024];
  
  (*glad_glBindFramebuffer)(0x8ca9,g_gl.framebuffers[0]);
  (*glad_glBindFramebuffer)(0x8ca8,g_gl.framebuffers[1]);
  (*glad_glViewport)(0,0,g_app.viewer.w,g_app.viewer.h);
  (*glad_glClearColor)(0.0,0.0,0.0,0.0);
  (*glad_glClear)(0x4000);
  (*glad_glUseProgram)(g_gl.programs[0]);
  (*glad_glBindVertexArray)(g_gl.vertexArrays[0]);
  (*glad_glDrawArrays)(5,0,4);
  if (g_app.viewer.hud == true) {
    ImGui_ImplGlfwGL3_NewFrame();
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = -0x79;
    buf[3] = 'C';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = ' ';
    buf[7] = 'A';
    aaItems[0] = (char *)0x0;
    ImGui::SetNextWindowPos((ImVec2 *)buf,0,(ImVec2 *)aaItems);
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = 'z';
    buf[3] = 'C';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = -0x10;
    buf[7] = 'B';
    ImGui::SetNextWindowSize((ImVec2 *)buf,0);
    ImGui::Begin("Framebuffer",(bool *)0x0,0);
    aaItems[4] = "MSAA x16";
    aaItems[2] = "MSAA x4";
    aaItems[3] = "MSAA x8";
    aaItems[0] = "None";
    aaItems[1] = "MSAA x2";
    bVar1 = ImGui::Combo("AA",&g_framebuffer.aa,aaItems,5,-1);
    if (bVar1) {
      imguiSetAa();
    }
    bVar1 = ImGui::Combo("MSAA",&g_framebuffer.msaa.fixed,"Fixed",-1);
    if (bVar1) {
      imguiSetAa();
    }
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    bVar1 = ImGui::Button("Screenshot",(ImVec2 *)buf);
    if (bVar1) {
      snprintf(buf,0x400,"screenshot%03i",(ulong)(uint)renderGui::cnt);
      (*glad_glBindFramebuffer)(0x8ca8,0);
      djgt_save_glcolorbuffer_png(0x404,0x1908,buf);
      renderGui::cnt = renderGui::cnt + 1;
    }
    ImGui::SameLine(0.0,-1.0);
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    bVar1 = ImGui::Button("Record",(ImVec2 *)buf);
    if (bVar1) {
      g_app.recorder.on = (int)(g_app.recorder.on == 0);
    }
    if (g_app.recorder.on != 0) {
      ImGui::SameLine(0.0,-1.0);
      ImGui::Text("Recording...");
    }
    ImGui::End();
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = ' ';
    buf[3] = 'A';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = ' ';
    buf[7] = 'A';
    aaItems[0] = (char *)0x0;
    ImGui::SetNextWindowPos((ImVec2 *)buf,0,(ImVec2 *)aaItems);
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = 'z';
    buf[3] = 'C';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = -0x10;
    buf[7] = 'B';
    ImGui::SetNextWindowSize((ImVec2 *)buf,0);
    ImGui::Begin("Camera",(bool *)0x0,0);
    bVar1 = ImGui::SliderFloat("FOVY",&g_camera.fovy,1.0,179.0,"%.3f",1.0);
    if (bVar1) {
      configureCatmullClarkProgram();
    }
    bVar1 = ImGui::SliderFloat("zNear",&g_camera.zNear,0.01,100.0,"%.3f",1.0);
    if ((bVar1) && (g_camera.zFar <= g_camera.zNear)) {
      g_camera.zNear = g_camera.zFar + -0.01;
    }
    bVar1 = ImGui::SliderFloat("zFar",&g_camera.zFar,1.0,1500.0,"%.3f",1.0);
    if ((bVar1) && (g_camera.zFar <= g_camera.zNear)) {
      g_camera.zFar = g_camera.zNear + 0.01;
    }
    ImGui::End();
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = ' ';
    buf[3] = 'A';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\f';
    buf[7] = 'C';
    aaItems[0] = (char *)0x0;
    ImGui::SetNextWindowPos((ImVec2 *)buf,0,(ImVec2 *)aaItems);
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = -1;
    buf[3] = 'C';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\x11';
    buf[7] = 'D';
    ImGui::SetNextWindowSize((ImVec2 *)buf,0);
    ImGui::Begin("Patch",(bool *)0x0,0);
    aaItems[0] = "Tessellation Shader";
    aaItems[1] = "Geometry Shader";
    uVar5 = SUB84(cpuDt,0);
    if (cpuDt < 1.0) {
      uVar5 = SUB84(cpuDt * 1000.0,0);
    }
    pcVar2 = " s";
    pcVar3 = " s";
    if (cpuDt < 1.0) {
      pcVar3 = "ms";
    }
    ImGui::Text("CPU_dt: %.3f %s",uVar5,pcVar3);
    ImGui::SameLine(0.0,-1.0);
    uVar5 = SUB84(gpuDt,0);
    if (gpuDt < 1.0) {
      uVar5 = SUB84(gpuDt * 1000.0,0);
      pcVar2 = "ms";
    }
    ImGui::Text("GPU_dt: %.3f %s",uVar5,pcVar2);
    bVar1 = ImGui::Combo("Method",&g_patch.method,aaItems,2,-1);
    if (bVar1) {
      loadCatmullClarkProgram();
      g_patch.flags.reset = true;
    }
    ImGui::Text("flags: ");
    ImGui::SameLine(0.0,-1.0);
    bVar1 = ImGui::Checkbox("uniform",&g_patch.flags.uniform);
    if (bVar1) {
      loadCatmullClarkProgram();
    }
    ImGui::SameLine(0.0,-1.0);
    bVar1 = ImGui::Checkbox("cull",&g_patch.flags.cull);
    if (bVar1) {
      loadCatmullClarkProgram();
    }
    ImGui::SameLine(0.0,-1.0);
    ImGui::Checkbox("wire",&g_patch.flags.wire);
    ImGui::SameLine(0.0,-1.0);
    bVar1 = ImGui::Checkbox("freeze",&g_patch.flags.freeze);
    if (bVar1) {
      loadCatmullClarkProgram();
    }
    ImGui::SameLine(0.0,-1.0);
    ImGui::Checkbox("net",&g_patch.flags.net);
    bVar1 = ImGui::SliderInt("PatchSubdLevel",&g_patch.gpuSubd,0,6,"%d");
    if (bVar1) {
      loadCatmullClarkProgram();
      g_patch.flags.reset = true;
    }
    if (g_patch.flags.uniform == true) {
      bVar1 = ImGui::SliderInt("SubdLevel",&g_patch.uniformSubd,0,0xf,"%d");
      if (bVar1) {
        loadCatmullClarkProgram();
      }
    }
    else {
      bVar1 = ImGui::SliderFloat("ScreenRes",&g_patch.primitivePixelLengthTarget,1.0,64.0,"%.3f",1.0
                                );
      if (bVar1) {
        configureCatmullClarkProgram();
      }
    }
    ImGui::Text("control patch vertices:");
    v = &g_patch;
    for (uVar4 = 0; uVar4 != 0x10; uVar4 = uVar4 + 1) {
      sprintf(buf,"v%02i",uVar4 & 0xffffffff);
      bVar1 = ImGui::SliderFloat3(buf,(float *)v,-4.0,4.0,"%.3f",1.0);
      if (bVar1) {
        loadPatchBuffer();
      }
      v = (PatchManager *)(v->vertices + 1);
    }
    ImGui::End();
    ImGui::Render();
    draw_data = ImGui::GetDrawData();
    ImGui_ImplGlfwGL3_RenderDrawData(draw_data);
  }
  if (g_app.recorder.on != 0) {
    (*glad_glBindFramebuffer)(0x8ca8,g_gl.framebuffers[0]);
    sprintf((char *)aaItems,"capture_%02i_%09i",(ulong)(uint)g_app.recorder.capture,
            (ulong)(uint)g_app.recorder.frame);
    strcat2(buf,g_app.dir.output,(char *)aaItems);
    djgt_save_glcolorbuffer_bmp(0x8ce0,0x1907,buf);
    g_app.recorder.frame = g_app.recorder.frame + 1;
  }
  (*glad_glBindFramebuffer)(0x8ca9,0);
  (*glad_glBindFramebuffer)(0x8ca8,0);
  return;
}

Assistant:

void renderGui(double cpuDt, double gpuDt)
{
    glBindFramebuffer(GL_DRAW_FRAMEBUFFER, g_gl.framebuffers[FRAMEBUFFER_BACK]);
    glBindFramebuffer(GL_READ_FRAMEBUFFER, g_gl.framebuffers[FRAMEBUFFER_SCENE]);
    glViewport(0, 0, g_app.viewer.w, g_app.viewer.h);
    glClearColor(0, 0, 0, 0);
    glClear(GL_COLOR_BUFFER_BIT);

    // post process the scene framebuffer
    glUseProgram(g_gl.programs[PROGRAM_VIEWER]);
    glBindVertexArray(g_gl.vertexArrays[VERTEXARRAY_EMPTY]);
    glDrawArrays(GL_TRIANGLE_STRIP, 0, 4);

    // draw HUD
    if (g_app.viewer.hud) {
        // ImGui
        ImGui_ImplGlfwGL3_NewFrame();
        // Viewer Widgets
        ImGui::SetNextWindowPos(ImVec2(270, 10)/*, ImGuiSetCond_FirstUseEver*/);
        ImGui::SetNextWindowSize(ImVec2(250, 120)/*, ImGuiSetCond_FirstUseEver*/);
        ImGui::Begin("Framebuffer");
        {
            const char* aaItems[] = {
                "None",
                "MSAA x2",
                "MSAA x4",
                "MSAA x8",
                "MSAA x16"
            };
            if (ImGui::Combo("AA", &g_framebuffer.aa, aaItems, BUFFER_SIZE(aaItems)))
                imguiSetAa();
            if (ImGui::Combo("MSAA", &g_framebuffer.msaa.fixed, "Fixed\0Random\0\0"))
                imguiSetAa();
            if (ImGui::Button("Screenshot")) {
                static int cnt = 0;
                char buf[1024];

                snprintf(buf, 1024, "screenshot%03i", cnt);
                glBindFramebuffer(GL_READ_FRAMEBUFFER, 0);
                djgt_save_glcolorbuffer_png(GL_FRONT, GL_RGBA, buf);
                ++cnt;
            }
            ImGui::SameLine();
            if (ImGui::Button("Record"))
                g_app.recorder.on = !g_app.recorder.on;
            if (g_app.recorder.on) {
                ImGui::SameLine();
                ImGui::Text("Recording...");
            }
        }
        ImGui::End();
#if 0
        // Framebuffer Widgets
        ImGui::SetNextWindowPos(ImVec2(530, 10)/*, ImGuiSetCond_FirstUseEver*/);
        ImGui::SetNextWindowSize(ImVec2(250, 120)/*, ImGuiSetCond_FirstUseEver*/);
        ImGui::Begin("Viewer");
        {
            if (ImGui::SliderFloat("Exposure", &g_app.viewer.exposure, -3.0f, 3.0f))
                configureViewerProgram();
            if (ImGui::SliderFloat("Gamma", &g_app.viewer.gamma, 1.0f, 4.0f))
                configureViewerProgram();
        }
        ImGui::End();
#endif
        // Camera Widgets
        ImGui::SetNextWindowPos(ImVec2(10, 10)/*, ImGuiSetCond_FirstUseEver*/);
        ImGui::SetNextWindowSize(ImVec2(250, 120)/*, ImGuiSetCond_FirstUseEver*/);
        ImGui::Begin("Camera");
        {
            if (ImGui::SliderFloat("FOVY", &g_camera.fovy, 1.0f, 179.0f)) {
                configureCatmullClarkProgram();
            }
            if (ImGui::SliderFloat("zNear", &g_camera.zNear, 0.01f, 100.f)) {
                if (g_camera.zNear >= g_camera.zFar)
                    g_camera.zNear = g_camera.zFar - 0.01f;
            }
            if (ImGui::SliderFloat("zFar", &g_camera.zFar, 1.f, 1500.f)) {
                if (g_camera.zFar <= g_camera.zNear)
                    g_camera.zFar = g_camera.zNear + 0.01f;
            }
        }
        ImGui::End();
        // Subd Patch Widgets
        ImGui::SetNextWindowPos(ImVec2(10, 140)/*, ImGuiSetCond_FirstUseEver*/);
        ImGui::SetNextWindowSize(ImVec2(510, 580)/*, ImGuiSetCond_FirstUseEver*/);
        ImGui::Begin("Patch");
        {
            const char* eMethods[] = {
                "Tessellation Shader",
                "Geometry Shader"
            };
            ImGui::Text("CPU_dt: %.3f %s",
                        cpuDt < 1. ? cpuDt * 1e3 : cpuDt,
                        cpuDt < 1. ? "ms" : " s");
            ImGui::SameLine();
            ImGui::Text("GPU_dt: %.3f %s",
                        gpuDt < 1. ? gpuDt * 1e3 : gpuDt,
                        gpuDt < 1. ? "ms" : " s");
            if (ImGui::Combo("Method", &g_patch.method, eMethods, BUFFER_SIZE(eMethods))) {
                loadCatmullClarkProgram();
                g_patch.flags.reset = true;
            }
            ImGui::Text("flags: ");
            ImGui::SameLine();
            if (ImGui::Checkbox("uniform", &g_patch.flags.uniform))
                loadCatmullClarkProgram();
            ImGui::SameLine();
            if (ImGui::Checkbox("cull", &g_patch.flags.cull))
                loadCatmullClarkProgram();
            ImGui::SameLine();
            ImGui::Checkbox("wire", &g_patch.flags.wire);
            ImGui::SameLine();
            if (ImGui::Checkbox("freeze", &g_patch.flags.freeze))
                loadCatmullClarkProgram();
            ImGui::SameLine();
            ImGui::Checkbox("net", &g_patch.flags.net);

            if (ImGui::SliderInt("PatchSubdLevel", &g_patch.gpuSubd, 0, 6)) {
                loadCatmullClarkProgram();
                g_patch.flags.reset = true;
            }
            if (g_patch.flags.uniform) {
                if (ImGui::SliderInt("SubdLevel", &g_patch.uniformSubd, 0, 15)) {
                    loadCatmullClarkProgram();
                }
            } else {
                if (ImGui::SliderFloat("ScreenRes", &g_patch.primitivePixelLengthTarget, 1, 64)) {
                    configureCatmullClarkProgram();
                }
            }
            ImGui::Text("control patch vertices:");
            for (int i = 0; i < BUFFER_SIZE(g_patch.vertices); ++i) {
                char name[64];

                sprintf(name, "v%02i", i);
                if (ImGui::SliderFloat3(name, &(g_patch.vertices[i].x), -4.0f, 4.0f)) {
                    loadPatchBuffer();
                }
            }
        }
        ImGui::End();

        ImGui::Render();
        ImGui_ImplGlfwGL3_RenderDrawData(ImGui::GetDrawData());
    }

    // screen recording
    if (g_app.recorder.on) {
        char name[64], path[1024];

        glBindFramebuffer(GL_READ_FRAMEBUFFER, g_gl.framebuffers[FRAMEBUFFER_BACK]);
        sprintf(name, "capture_%02i_%09i",
                g_app.recorder.capture,
                g_app.recorder.frame);
        strcat2(path, g_app.dir.output, name);
        djgt_save_glcolorbuffer_bmp(GL_COLOR_ATTACHMENT0, GL_RGB, path);
        ++g_app.recorder.frame;
    }

    // restore state
    glBindFramebuffer(GL_DRAW_FRAMEBUFFER, 0);
    glBindFramebuffer(GL_READ_FRAMEBUFFER, 0);
}